

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  StringPtr local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined8 local_30;
  Array<kj::CappedArray<char,_14UL>_> local_28;
  
  local_48 = *(undefined8 *)*param_2;
  uStack_40 = ((undefined8 *)*param_2)[1];
  local_38 = ", ";
  local_30 = 3;
  local_28.ptr = (CappedArray<char,_14UL> *)0x0;
  local_28.size_ = 0;
  local_28.disposer = (ArrayDisposer *)0x0;
  local_58.content.ptr = "(can\'t stringify)";
  local_58.content.size_ = 0x12;
  concat<kj::_::Delimited<kj::ArrayPtr<char16_t_const>>,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_48,
             (Delimited<kj::ArrayPtr<const_char16_t>_> *)(param_2 + 2),&local_58,param_5);
  Array<kj::CappedArray<char,_14UL>_>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}